

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O0

void __thiscall OpenMD::Globals::~Globals(Globals *this)

{
  undefined8 *in_RDI;
  DataHolder *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
  *in_stack_ffffffffffffffe0;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *this_01;
  
  *in_RDI = &PTR__Globals_00500248;
  Utils::
  deletePointers<std::map<std::__cxx11::string,OpenMD::MoleculeStamp*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>>>
            (in_stack_ffffffffffffffe0);
  Utils::deletePointers<std::vector<OpenMD::Component*,std::allocator<OpenMD::Component*>>>
            ((vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)
             in_stack_ffffffffffffffe0);
  Utils::deletePointers<std::vector<OpenMD::ZConsStamp*,std::allocator<OpenMD::ZConsStamp*>>>
            ((vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)
             in_stack_ffffffffffffffe0);
  Utils::
  deletePointers<std::vector<OpenMD::RestraintStamp*,std::allocator<OpenMD::RestraintStamp*>>>
            ((vector<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_> *)
             in_stack_ffffffffffffffe0);
  if ((long *)in_RDI[0x2ba] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[0x2ba] + 8))();
  }
  this_01 = (vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)in_RDI[699];
  if (this_01 != (vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> *)0x0) {
    (*(code *)(((_Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_> *
                )&this_01->
                  super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>)->
              _M_impl).super__Vector_impl_data._M_start[1])();
  }
  if ((long *)in_RDI[700] != (long *)0x0) {
    (**(code **)(*(long *)in_RDI[700] + 8))();
  }
  this_00 = (DataHolder *)in_RDI[0x2bd];
  if (this_00 != (DataHolder *)0x0) {
    (*((ParameterBase *)&this_00->_vptr_DataHolder)->_vptr_ParameterBase[1])();
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
          *)0x29e79d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          *)0x29e7ae);
  std::vector<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>::~vector
            ((vector<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_> *)this_01)
  ;
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::~vector
            ((vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)this_01);
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::~vector(this_01);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e814);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)this_00);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)this_00);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e858);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)this_00);
  Parameter<std::vector<double,_std::allocator<double>_>_>::~Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)this_00);
  Parameter<int>::~Parameter((Parameter<int> *)0x29e88b);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e89c);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29e8cf);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e8e0);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e8f1);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e902);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e913);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e924);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29e935);
  Parameter<int>::~Parameter((Parameter<int> *)0x29e946);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29e957);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29e968);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e979);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e98a);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29e99b);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29e9ac);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e9bd);
  Parameter<double>::~Parameter((Parameter<double> *)0x29e9ce);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<int>::~Parameter((Parameter<int> *)0x29e9f0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ea12);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea23);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea34);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea45);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea56);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea67);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea78);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ea89);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29eabc);
  Parameter<double>::~Parameter((Parameter<double> *)0x29eacd);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eade);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eaef);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eb22);
  Parameter<std::pair<int,_int>_>::~Parameter((Parameter<std::pair<int,_int>_> *)0x29eb33);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eb44);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eb55);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eb66);
  Parameter<double>::~Parameter((Parameter<double> *)0x29eb77);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ebaa);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ebbb);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ebcc);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ebdd);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ebee);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ebff);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ec10);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ec21);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ec32);
  Parameter<unsigned_long>::~Parameter((Parameter<unsigned_long> *)0x29ec43);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ec65);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ec76);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ec87);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ec98);
  Parameter<double>::~Parameter((Parameter<double> *)0x29eca9);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ecba);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eccb);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ecdc);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29eced);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ecfe);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ed0f);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ed20);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x29ed31);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ed42);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ed53);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ed64);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ed75);
  Parameter<double>::~Parameter((Parameter<double> *)0x29ed86);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29eda8);
  Parameter<double>::~Parameter((Parameter<double> *)0x29edb9);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  Parameter<double>::~Parameter((Parameter<double> *)0x29eddb);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00);
  DataHolder::~DataHolder(this_00);
  return;
}

Assistant:

Globals::~Globals() {
    Utils::deletePointers(moleculeStamps_);

    Utils::deletePointers(components_);
    Utils::deletePointers(zconstraints_);
    Utils::deletePointers(restraints_);

    delete flucQpars_;
    delete rnemdPars_;
    delete lightPars_;
    delete minimizerPars_;
  }